

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-test-part.cc
# Opt level: O0

string * __thiscall
testing::TestPartResult::ExtractSummary_abi_cxx11_
          (string *__return_storage_ptr__,TestPartResult *this,char *message)

{
  char *__beg;
  char *__end;
  string *__a;
  undefined2 in_stack_ffffffffffffffc8;
  byte bVar1;
  undefined5 in_stack_ffffffffffffffcb;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  bool local_22;
  allocator<char> local_21;
  char *local_20;
  char *stack_trace;
  char *message_local;
  
  __a = __return_storage_ptr__;
  stack_trace = (char *)this;
  message_local = (char *)__return_storage_ptr__;
  __end = strstr((char *)this,"\nStack trace:\n");
  __beg = stack_trace;
  bVar1 = 0;
  local_20 = __end;
  if (__end != (char *)0x0) {
    std::allocator<char>::allocator();
    bVar1 = 1;
    std::__cxx11::string::string<char_const*,void>
              ((string *)__return_storage_ptr__,__beg,__end,
               (allocator<char> *)&stack0xffffffffffffffcb);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffd0,
               (char *)CONCAT53(in_stack_ffffffffffffffcb,CONCAT12(bVar1,in_stack_ffffffffffffffc8))
               ,(allocator<char> *)__a);
  }
  local_22 = __end == (char *)0x0;
  if ((bVar1 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffcb);
  }
  if (local_22) {
    std::allocator<char>::~allocator(&local_21);
  }
  return __a;
}

Assistant:

std::string TestPartResult::ExtractSummary(const char* message) {
  const char* const stack_trace = strstr(message, internal::kStackTraceMarker);
  return stack_trace == NULL ? message :
      std::string(message, stack_trace);
}